

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bind.cpp
# Opt level: O2

void __thiscall lambda_bind_mem_fn_Test::TestBody(lambda_bind_mem_fn_Test *this)

{
  AssertionResult *pAVar1;
  int iVar2;
  AssertionResult *this_00;
  char *pcVar3;
  AssertHelper local_78;
  AssertionResult gtest_ar_1;
  int local_60 [2];
  Thing thing;
  int local_54;
  AssertionResult gtest_ar;
  int local_28;
  int local_24;
  
  gtest_ar_1._0_8_ = Thing::fn;
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78.data_ = (AssertHelperData *)&thing;
  local_60[1] = 1;
  local_54 = 2;
  local_28 = 3;
  local_60[0] = lambda::invoke<int(Thing::*const&)(int,int,int),Thing*,int,int,int>
                          ((offset_in_Thing_to_subr *)&gtest_ar_1,(Thing **)&local_78,local_60 + 1,
                           &local_54,&local_28);
  local_24 = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"lmd::bind(&Thing::fn)(&thing, 1, 2, 3)","6",local_60,&local_24);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
               ,0x19,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_1);
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    this_00 = &gtest_ar_1;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar._0_8_ = Thing::fn;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_60[0] = 1;
    local_60[1] = 2;
    local_54 = 3;
    iVar2 = lambda::bind<int(Thing::*)(int,int,int),Thing*>(int(Thing::*)(int,int,int),Thing*&&)::
            {lambda((auto:1&&)...)#1}::operator()
                      ((_lambda__auto_1________1_ *)&gtest_ar,local_60,local_60 + 1,&local_54);
    local_78.data_._0_4_ = iVar2;
    local_28 = 6;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, &thing)(1, 2, 3)","6",(int *)&local_78
               ,&local_28);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar);
      if (gtest_ar_1.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                 ,0x1a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      gtest_ar._0_8_ = Thing::fn;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_60[0] = 2;
      local_60[1] = 3;
      iVar2 = lambda::
              bind<int(Thing::*)(int,int,int),Thing*,int>(int(Thing::*)(int,int,int),Thing*&&,int&&)
              ::{lambda((auto:1&&)...)#1}::operator()(&gtest_ar,local_60,local_60 + 1);
      local_78.data_._0_4_ = iVar2;
      local_54 = 6;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, &thing, 1)(2, 3)","6",
                 (int *)&local_78,&local_54);
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                   ,0x1b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_1.message_);
        gtest_ar._0_8_ = Thing::fn;
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_60[0] = 3;
        iVar2 = lambda::
                bind<int(Thing::*)(int,int,int),Thing*,int,int>(int(Thing::*)(int,int,int),Thing*&&,int&&,int&&)
                ::{lambda((auto:1&&)...)#1}::operator()
                          ((_lambda__auto_1________1_ *)&gtest_ar,local_60);
        local_78.data_._0_4_ = iVar2;
        local_60[1] = 6;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, &thing, 1, 2)(3)","6",
                   (int *)&local_78,local_60 + 1);
        if (gtest_ar_1.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_1.message_);
          gtest_ar._0_8_ = Thing::fn;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          iVar2 = anon_class_40_5_21af6246::operator()<>((anon_class_40_5_21af6246 *)&gtest_ar);
          local_78.data_._0_4_ = iVar2;
          local_60[0] = 6;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar_1,"lmd::bind(&Thing::fn, &thing, 1, 2, 3)()","6",
                     (int *)&local_78,local_60);
          if (gtest_ar_1.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar);
            if (gtest_ar_1.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                       ,0x1d,pcVar3);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
          }
          pAVar1 = &gtest_ar_1;
          goto LAB_0013864a;
        }
        testing::Message::Message((Message *)&gtest_ar);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/test/test_bind.cpp"
                   ,0x1c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar);
      }
    }
    pAVar1 = &gtest_ar_1;
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    this_00 = &gtest_ar;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_0013864a:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  return;
}

Assistant:

TEST(lambda, bind_mem_fn) {
    Thing thing;
    ASSERT_EQ(lmd::bind(&Thing::fn)(&thing, 1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing)(1, 2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1)(2, 3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1, 2)(3), 6);
    ASSERT_EQ(lmd::bind(&Thing::fn, &thing, 1, 2, 3)(), 6);
}